

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  uint32_t hash;
  LRUHandle **ppLVar3;
  ulong uVar4;
  char *this_00;
  
  hash = Hash(key->data_,key->size_,0);
  uVar4 = (ulong)((hash >> 0x1c) * 0x90);
  this_00 = this->shard_[0].lru_.key_data + (uVar4 - 0x70);
  port::Mutex::Lock((Mutex *)this_00);
  ppLVar3 = HandleTable::FindPointer
                      ((HandleTable *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar4 - 0x40)),
                       key,hash);
  pLVar1 = *ppLVar3;
  if (pLVar1 != (LRUHandle *)0x0) {
    pLVar1->refs = pLVar1->refs + 1;
    pLVar2 = pLVar1->next;
    pLVar2->prev = pLVar1->prev;
    pLVar1->prev->next = pLVar2;
    pLVar1->next = (LRUHandle *)(this->shard_[0].lru_.key_data + (uVar4 - 0x40));
    pLVar2 = *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar4 - 0x20));
    pLVar1->prev = pLVar2;
    pLVar2->next = pLVar1;
    pLVar1->next->prev = pLVar1;
  }
  port::Mutex::Unlock((Mutex *)this_00);
  return (Handle *)pLVar1;
}

Assistant:

virtual Handle *Lookup(const Slice &key) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Lookup(key, hash);
            }